

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O2

PropertyQueryFlags __thiscall
Js::JavascriptProxy::GetItemReferenceQuery
          (JavascriptProxy *this,Var originalInstance,uint32 index,Var *value,
          ScriptContext *requestContext)

{
  Type *this_00;
  ImplicitCallFlags IVar1;
  PropertyId propertyId;
  Type TVar2;
  ScriptContext *scriptContext;
  ThreadContext *this_01;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  PropertyQueryFlags PVar7;
  Attributes attributes;
  RecyclableObject *pRVar8;
  JavascriptFunction *pJVar9;
  Var pvVar10;
  JavascriptFunction *pJVar11;
  undefined4 *puVar12;
  PropertyDescriptor *this_02;
  PropertyDescriptor local_108;
  PropertyRecord *local_d8;
  PropertyRecord *propertyRecord;
  PropertyDescriptor result;
  char cStack_7d;
  char cStack_7c;
  char cStack_7b;
  RecyclableObject *local_48;
  
  PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&propertyRecord);
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  this_01 = requestContext->threadContext;
  if ((this_01->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    pRVar8 = MarshalHandler(this,requestContext);
    if (pRVar8 != (RecyclableObject *)0x0) {
      pRVar8 = MarshalTarget(this,requestContext);
      pJVar9 = GetMethodHelper(this,0x198,requestContext);
      if ((pJVar9 == (JavascriptFunction *)0x0) ||
         (bVar4 = ScriptContext::IsHeapEnumInProgress(requestContext), bVar4)) {
        result.enumerableSpecified = false;
        BVar6 = JavascriptOperators::GetItem(originalInstance,pRVar8,index,value,requestContext);
        if (BVar6 == 0) goto LAB_00ba6df1;
      }
      else {
        PropertyIdFromInt(this,index,&local_d8);
        propertyId = local_d8->pid;
        result.enumerableSpecified = true;
        pvVar10 = GetName(requestContext,propertyId);
        bVar4 = this_01->reentrancySafeOrHandled;
        this_01->reentrancySafeOrHandled = true;
        result._40_8_ = this_01;
        attributes = FunctionInfo::GetAttributes((RecyclableObject *)pJVar9);
        bVar5 = ThreadContext::HasNoSideEffect(this_01,(RecyclableObject *)pJVar9,attributes);
        if (bVar5) {
          local_48 = (RecyclableObject *)
                     anon_func::anon_class_48_6_e6283461::operator()
                               ((anon_class_48_6_e6283461 *)&result.Configurable);
          bVar5 = ThreadContext::IsOnStack(local_48);
joined_r0x00ba6f6f:
          if (bVar5) {
            this_01->implicitCallFlags = this_01->implicitCallFlags | ImplicitCall_Accessor;
          }
        }
        else if ((this_01->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag)
        {
          if ((attributes & HasNoSideEffect) != None) {
            local_48 = (RecyclableObject *)
                       anon_func::anon_class_48_6_e6283461::operator()
                                 ((anon_class_48_6_e6283461 *)&result.Configurable);
            bVar5 = ThreadContext::IsOnStack(local_48);
            goto joined_r0x00ba6f6f;
          }
          IVar1 = this_01->implicitCallFlags;
          local_48 = (RecyclableObject *)
                     anon_func::anon_class_48_6_e6283461::operator()
                               ((anon_class_48_6_e6283461 *)&result.Configurable);
          this_01->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
        }
        else {
          this_01->implicitCallFlags = this_01->implicitCallFlags | ImplicitCall_Accessor;
          local_48 = (((((((((pJVar9->super_DynamicObject).super_RecyclableObject.type.ptr)->
                           javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
                       ->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
                     undefinedValue.ptr;
        }
        this_01->reentrancySafeOrHandled = bVar4;
        this_00 = &result.Configurable;
        PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)this_00);
        pJVar9 = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).defaultAccessorFunction.ptr;
        BVar6 = JavascriptOperators::GetOwnPropertyDescriptor
                          (pRVar8,propertyId,requestContext,(PropertyDescriptor *)this_00);
        if (BVar6 != 0) {
          JavascriptOperators::CompletePropertyDescriptor
                    ((PropertyDescriptor *)this_00,(PropertyDescriptor *)0x0,requestContext);
          cStack_7d = (char)((ulong)pvVar10 >> 0x18);
          if (((cStack_7d != '\x01') ||
              (bVar4 = PropertyDescriptor::IsConfigurable
                                 ((PropertyDescriptor *)&result.Configurable), bVar4)) ||
             (bVar4 = PropertyDescriptor::IsWritable((PropertyDescriptor *)&result.Configurable),
             bVar4)) {
            cStack_7c = (char)((ulong)pvVar10 >> 0x20);
            if (((cStack_7c != '\0') ||
                (cStack_7b = (char)((ulong)pvVar10 >> 0x28), cStack_7b == '\x01')) &&
               ((bVar4 = PropertyDescriptor::IsConfigurable
                                   ((PropertyDescriptor *)&result.Configurable), !bVar4 &&
                (pJVar11 = (JavascriptFunction *)
                           PropertyDescriptor::GetGetter((PropertyDescriptor *)&result.Configurable)
                , pJVar11 == pJVar9)))) {
              if (local_48 == (RecyclableObject *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar12 = 1;
                bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
                if (!bVar4) goto LAB_00ba720f;
                *puVar12 = 0;
              }
              bVar4 = TaggedInt::Is(local_48);
              if ((bVar4) || ((ulong)local_48 >> 0x32 != 0)) goto LAB_00ba71fb;
              pRVar8 = UnsafeVarTo<Js::RecyclableObject>(local_48);
              if (pRVar8 == (RecyclableObject *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar12 = 1;
                bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
                if (!bVar4) goto LAB_00ba720f;
                *puVar12 = 0;
              }
              TVar2 = ((pRVar8->type).ptr)->typeId;
              if (0x57 < (int)TVar2) {
                BVar6 = RecyclableObject::IsExternal(pRVar8);
                if (BVar6 == 0) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                  *puVar12 = 1;
                  bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                              ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                              "GetTypeId aValue has invalid TypeId");
                  if (!bVar4) {
LAB_00ba720f:
                    pcVar3 = (code *)invalidInstructionException();
                    (*pcVar3)();
                  }
                  *puVar12 = 0;
                }
LAB_00ba71fb:
                JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"get");
              }
              if (TVar2 != TypeIds_Undefined) goto LAB_00ba71fb;
            }
          }
          else {
            bVar4 = JavascriptConversion::SameValueCommon<false>(local_48,(Var)result._40_8_);
            if (!bVar4) goto LAB_00ba71fb;
          }
        }
        PropertyDescriptor::SetValue((PropertyDescriptor *)&propertyRecord,local_48);
        this_01->implicitCallFlags = this_01->implicitCallFlags | ImplicitCall_External;
      }
      if (result.enumerableSpecified != true) {
        return Property_Found;
      }
      this_02 = &local_108;
      PropertyDescriptor::PropertyDescriptor(&local_108,(PropertyDescriptor *)&propertyRecord);
      pRVar8 = (RecyclableObject *)
               GetValueFromDescriptor
                         ((JavascriptProxy *)this_02,originalInstance,&local_108,requestContext);
      PVar7 = Property_Found;
      goto LAB_00ba6dfe;
    }
    bVar4 = ThreadContext::RecordImplicitException(this_01);
    if (bVar4) {
      JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea15,L"get");
    }
  }
  else {
    this_01->implicitCallFlags = this_01->implicitCallFlags | ImplicitCall_External;
  }
LAB_00ba6df1:
  pRVar8 = ScriptContext::GetMissingItemResult(requestContext);
  PVar7 = Property_NotFound;
LAB_00ba6dfe:
  *value = pRVar8;
  return PVar7;
}

Assistant:

PropertyQueryFlags JavascriptProxy::GetItemReferenceQuery(Var originalInstance, uint32 index, Var* value, ScriptContext * requestContext)
    {
        const PropertyRecord* propertyRecord;
        auto fn = [&](RecyclableObject* object)-> BOOL {
            return JavascriptOperators::GetItem(originalInstance, object, index, value, requestContext);
        };
        auto getPropertyId = [&]() ->PropertyId {
            PropertyIdFromInt(index, &propertyRecord);
            return propertyRecord->GetPropertyId();
        };
        PropertyDescriptor result;
        BOOL foundProperty = GetPropertyTrap(originalInstance, &result, fn, getPropertyId, requestContext);
        if (!foundProperty)
        {
            *value = requestContext->GetMissingItemResult();
        }
        else if (result.IsFromProxy())
        {
            *value = GetValueFromDescriptor(originalInstance, result, requestContext);
        }
        return JavascriptConversion::BooleanToPropertyQueryFlags(foundProperty);
    }